

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O2

void __thiscall cm::String::String(String *this,string *s,Private param_2)

{
  element_type *peVar1;
  pointer pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Alloc_hider local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::make_shared<std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe8);
  _Var3._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->string_).
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_18._M_p;
  (this->string_).
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  local_18._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xfffffffffffffff0);
  peVar1 = (this->string_).
           super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pcVar2 = (peVar1->_M_dataplus)._M_p;
  (this->view_)._M_len = peVar1->_M_string_length;
  (this->view_)._M_str = pcVar2;
  return;
}

Assistant:

String::String(std::string&& s, Private)
  : string_(std::make_shared<std::string>(std::move(s)))
  , view_(this->string_->data(), this->string_->size())
{
}